

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

SSL_SESSION * SSL_SESSION_copy_without_early_data(SSL_SESSION *session)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_SESSION> copy;
  SSL_SESSION *session_local;
  
  iVar3 = SSL_SESSION_early_data_capable(session);
  if (iVar3 == 0) {
    bssl::UpRef((bssl *)&copy,session);
    session_local = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release(&copy);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
  }
  else {
    bssl::SSL_SESSION_dup((bssl *)&local_28,session,3);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
    if (bVar2) {
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar4->ticket_max_early_data = 0;
      bVar1 = session->field_0x1b8;
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      psVar4->field_0x1b8 = psVar4->field_0x1b8 & 0xfb | bVar1 & 4;
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_28);
      iVar3 = SSL_SESSION_early_data_capable(psVar4);
      if (iVar3 != 0) {
        __assert_fail("!SSL_SESSION_early_data_capable(copy.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                      ,0x402,"SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *)");
      }
      session_local = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release(&local_28);
    }
    else {
      session_local = (SSL_SESSION *)0x0;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  }
  return session_local;
}

Assistant:

SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *session) {
  if (!SSL_SESSION_early_data_capable(session)) {
    return UpRef(session).release();
  }

  bssl::UniquePtr<SSL_SESSION> copy =
      SSL_SESSION_dup(session, SSL_SESSION_DUP_ALL);
  if (!copy) {
    return nullptr;
  }

  copy->ticket_max_early_data = 0;
  // Copied sessions are non-resumable until they're completely filled in.
  copy->not_resumable = session->not_resumable;
  assert(!SSL_SESSION_early_data_capable(copy.get()));
  return copy.release();
}